

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

bool __thiscall OpenMD::RigidBody::getAtomRefCoor(RigidBody *this,Vector3d *coor,uint index)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  uint in_EDX;
  Vector3<double> *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  bool local_1;
  
  uVar1 = (ulong)in_EDX;
  sVar2 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size
                    ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                     (in_RDI[0xc].super_Vector<double,_3U>.data_ + 1));
  if (sVar2 <= uVar1) {
    sVar3 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                       (in_RDI[0xc].super_Vector<double,_3U>.data_ + 1));
    snprintf(painCave.errMsg,2000,
             "Index %d is an invalid index, the current rigid body contains %zu atoms.\n",
             (ulong)in_EDX,sVar3);
    painCave.isFatal = 0;
    simError();
  }
  else {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RDI[0xe].super_Vector<double,_3U>.data_ + 1),(ulong)in_EDX);
    Vector3<double>::operator=
              (in_RDI,(Vector3<double> *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  local_1 = sVar2 > uVar1;
  return local_1;
}

Assistant:

bool RigidBody::getAtomRefCoor(Vector3d& coor, unsigned int index) {
    if (index < atoms_.size()) {
      coor = refCoords_[index];
      return true;
    } else {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Index %d is an invalid index, the current rigid body contains %zu "
          "atoms.\n",
          index, atoms_.size());
      painCave.isFatal = 0;
      simError();
      return false;
    }
  }